

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcAig.c
# Opt level: O1

int Abc_AigLevel(Abc_Ntk_t *pNtk)

{
  long *plVar1;
  int iVar2;
  uint uVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcAig.c"
                  ,0x128,"int Abc_AigLevel(Abc_Ntk_t *)");
  }
  if (pNtk->nBarBufs == 0) {
    lVar4 = (long)pNtk->vCos->nSize;
    if (lVar4 < 1) {
      uVar3 = 0;
    }
    else {
      lVar5 = 0;
      uVar3 = 0;
      do {
        plVar1 = (long *)pNtk->vCos->pArray[lVar5];
        uVar6 = *(uint *)(*(long *)(*(long *)(*(long *)(*plVar1 + 0x20) + 8) +
                                   (long)*(int *)plVar1[4] * 8) + 0x14) >> 0xc;
        if (uVar3 <= uVar6) {
          uVar3 = uVar6;
        }
        lVar5 = lVar5 + 1;
      } while (lVar4 != lVar5);
    }
    return uVar3;
  }
  iVar2 = Abc_NtkLevel(pNtk);
  return iVar2;
}

Assistant:

int Abc_AigLevel( Abc_Ntk_t * pNtk )
{
    Abc_Obj_t * pNode;
    int i, LevelsMax;
    assert( Abc_NtkIsStrash(pNtk) );
    if ( pNtk->nBarBufs )
        return Abc_NtkLevel( pNtk );
    // perform the traversal
    LevelsMax = 0;
    Abc_NtkForEachCo( pNtk, pNode, i )
        if ( LevelsMax < (int)Abc_ObjFanin0(pNode)->Level )
            LevelsMax = (int)Abc_ObjFanin0(pNode)->Level;
    return LevelsMax;
}